

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header7.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Header7::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Header7 *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Header7 *local_18;
  Header7 *this_local;
  
  local_18 = this;
  this_local = (Header7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header6::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header6);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((this->super_Header6).m_ui8PDUType < 0x48) {
    poVar1 = std::operator<<(local_190,"PDU Status:\n");
    poVar1 = std::operator<<(poVar1,"\tCoupled Extension Indicator: ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(byte)(this->super_Header6).field_0x24 >> 3 & 1);
    std::operator<<(poVar1,"\n");
    if (((((((this->super_Header6).m_ui8PDUType == '\x01') ||
           ((this->super_Header6).m_ui8PDUType == '\x17')) ||
          ((this->super_Header6).m_ui8PDUType == '\x18')) ||
         (((this->super_Header6).m_ui8PDUType == '\x19' ||
          ((this->super_Header6).m_ui8PDUType == '\x1a')))) ||
        ((this->super_Header6).m_ui8PDUType == '\x1b')) ||
       ((((this->super_Header6).m_ui8PDUType == '\x1c' ||
         ((this->super_Header6).m_ui8PDUType == '\x1f')) ||
        (((this->super_Header6).m_ui8PDUType == ' ' ||
         (((this->super_Header6).m_ui8PDUType == ')' || ((this->super_Header6).m_ui8PDUType == 'C'))
         )))))) {
      poVar1 = std::operator<<(local_190,"\tTransferred Entity Indicator: ");
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,(byte)(this->super_Header6).field_0x24 & 1);
      std::operator<<(poVar1,"\n");
    }
    if ((((((((this->super_Header6).m_ui8PDUType == '\x01') ||
            ((this->super_Header6).m_ui8PDUType == '\x02')) ||
           ((this->super_Header6).m_ui8PDUType == '\x18')) ||
          (((this->super_Header6).m_ui8PDUType == '\x17' ||
           ((this->super_Header6).m_ui8PDUType == '\x19')))) ||
         ((((this->super_Header6).m_ui8PDUType == '\x1a' ||
           (((this->super_Header6).m_ui8PDUType == '\x1b' ||
            ((this->super_Header6).m_ui8PDUType == '\x1c')))) ||
          ((this->super_Header6).m_ui8PDUType == '\x1f')))) ||
        ((((this->super_Header6).m_ui8PDUType == ' ' || ((this->super_Header6).m_ui8PDUType == ')'))
         || ((this->super_Header6).m_ui8PDUType == 'C')))) ||
       ((((this->super_Header6).m_ui8PDUType == 'D' || ((this->super_Header6).m_ui8PDUType == 'E'))
        || (((this->super_Header6).m_ui8PDUType == 'F' ||
            ((this->super_Header6).m_ui8PDUType == 'G')))))) {
      poVar1 = std::operator<<(local_190,"\tLVC Indicator: ");
      DATA_TYPE::ENUMS::GetEnumAsStringLVCIndicator_abi_cxx11_
                (&local_1f0,(ENUMS *)(ulong)((byte)(this->super_Header6).field_0x24 >> 1 & 3),Value)
      ;
      poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    if ((this->super_Header6).m_ui8PDUType == '\x02') {
      if ((this->super_Header6).m_ui8PDUType != '\x03') {
        poVar1 = std::operator<<(local_190,"\tDetonation Type Indicator: ");
        poVar1 = (ostream *)
                 std::ostream::operator<<(poVar1,(byte)(this->super_Header6).field_0x25 & 3);
        std::operator<<(poVar1,"\n");
      }
    }
    else {
      poVar1 = std::operator<<(local_190,"\tFire Type Indicator: ");
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,(byte)(this->super_Header6).field_0x25 & 1);
      std::operator<<(poVar1,"\n");
    }
    if ((((this->super_Header6).m_ui8PDUType == '\x19') ||
        ((this->super_Header6).m_ui8PDUType == '\x1a')) ||
       ((this->super_Header6).m_ui8PDUType == '\x1b')) {
      poVar1 = std::operator<<(local_190,"\tRadio Attached Indicator: ");
      DATA_TYPE::ENUMS::GetEnumAsStringAttachedIndicator_abi_cxx11_
                (&local_210,(ENUMS *)(ulong)((byte)(this->super_Header6).field_0x25 & 3),Value_00);
      poVar1 = std::operator<<(poVar1,(string *)&local_210);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::~string((string *)&local_210);
    }
    else if (((this->super_Header6).m_ui8PDUType == '\x1f') ||
            ((this->super_Header6).m_ui8PDUType == ' ')) {
      poVar1 = std::operator<<(local_190,"\tIntercom Attached Indicator: ");
      DATA_TYPE::ENUMS::GetEnumAsStringAttachedIndicator_abi_cxx11_
                (&local_230,(ENUMS *)(ulong)((byte)(this->super_Header6).field_0x25 & 3),Value_01);
      poVar1 = std::operator<<(poVar1,(string *)&local_230);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::~string((string *)&local_230);
    }
    if ((this->super_Header6).m_ui8PDUType == '\x1c') {
      poVar1 = std::operator<<(local_190,"\tSimulation Mode: ");
      poVar1 = (ostream *)
               std::ostream::operator<<(poVar1,(byte)(this->super_Header6).field_0x26 >> 1 & 1);
      std::operator<<(poVar1,"\n");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Header7::GetAsString() const
{
    KStringStream ss;

    ss << Header6::GetAsString();

    // Append the status flags this PDU should have
    if( m_ui8PDUType < Attribute_PDU_Type )
    {
        //
        // CEI - Applies to every PDU except attribute
        //
        ss << "PDU Status:\n"
           << "\tCoupled Extension Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusCEI << "\n";

        //
        // TEI - Applies to various PDU
        //
        if( m_ui8PDUType == Entity_State_PDU_Type               ||
            m_ui8PDUType == Electromagnetic_Emission_PDU_Type   ||
            m_ui8PDUType == Designator_PDU_Type                 ||
            m_ui8PDUType == Transmitter_PDU_Type                ||
            m_ui8PDUType == Signal_PDU_Type                     ||
            m_ui8PDUType == Receiver_PDU_Type                   ||
            m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type            ||
            m_ui8PDUType == IntercomSignal_PDU_Type             ||
            m_ui8PDUType == IntercomControl_PDU_Type            ||
            m_ui8PDUType == EnvironmentalProcess_PDU_Type       ||
            m_ui8PDUType == EntityStateUpdate_PDU_Type )
        {
            ss << "\tTransferred Entity Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusTEI << "\n";
        }

        //
        // LVC - Applies to various PDU
        //
        if( m_ui8PDUType == Entity_State_PDU_Type               ||
            m_ui8PDUType == Fire_PDU_Type                       ||
            m_ui8PDUType == Designator_PDU_Type                 ||
            m_ui8PDUType == Electromagnetic_Emission_PDU_Type   ||
            m_ui8PDUType == Transmitter_PDU_Type                ||
            m_ui8PDUType == Signal_PDU_Type                     ||
            m_ui8PDUType == Receiver_PDU_Type                   ||
            m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type            ||
            m_ui8PDUType == IntercomSignal_PDU_Type             ||
            m_ui8PDUType == IntercomControl_PDU_Type            ||
            m_ui8PDUType == EnvironmentalProcess_PDU_Type       ||
            m_ui8PDUType == EntityStateUpdate_PDU_Type          ||
            m_ui8PDUType == DirectedEnergyFire_PDU_Type         ||
            m_ui8PDUType == EntityDamageStatus_PDU_Type         ||
            m_ui8PDUType == IO_Action_PDU_Type                  ||
            m_ui8PDUType == IO_Report_PDU_Type )
        {
            ss << "\tLVC Indicator: " << GetEnumAsStringLVCIndicator( m_PDUStatusUnion.m_ui8PDUStatusLVC ) << "\n";
        }

        //
        // FTI - Fire PDU only or DTI - Detonation PDU only
        //
        if( m_ui8PDUType != Fire_PDU_Type )
        {
            ss << "\tFire Type Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusFTI << "\n";
        }
        else if( m_ui8PDUType != Detonation_PDU_Type )
        {
            ss << "\tDetonation Type Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI << "\n";
        }

        //
        // RAI - Transmitter(25), Signal(26), Receiver(27) or IAI  - IntercomSignal(31), IntercomControl(32)
        //
        if( m_ui8PDUType == Transmitter_PDU_Type  ||
            m_ui8PDUType == Signal_PDU_Type       ||
            m_ui8PDUType == Receiver_PDU_Type )
        {
            ss << "\tRadio Attached Indicator: " << GetEnumAsStringAttachedIndicator( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI ) << "\n";
        }
        else if( m_ui8PDUType == IntercomSignal_PDU_Type  ||
                 m_ui8PDUType == IntercomControl_PDU_Type )
        {
            ss << "\tIntercom Attached Indicator: " << GetEnumAsStringAttachedIndicator( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI ) << "\n";
        }

        //
        // SM - IFF ATC NAVAIDS(28) only
        //
        if( m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type )
        {
            ss << "\tSimulation Mode: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusSM << "\n";
        }
    }

    return ss.str();
}